

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_utf_len(char *str,int len)

{
  int in_ESI;
  nk_rune *in_RDI;
  nk_rune unicode;
  int src_len;
  int glyph_len;
  int text_len;
  int glyphs;
  char *text;
  int local_30;
  int local_2c;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  local_4 = 0;
  local_30 = 0;
  if ((in_RDI == (nk_rune *)0x0) || (in_ESI == 0)) {
    local_4 = 0;
  }
  else {
    local_2c = nk_utf_decode((char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDI,0);
    while (local_2c != 0 && local_30 < in_ESI) {
      local_4 = local_4 + 1;
      local_30 = local_30 + local_2c;
      local_2c = nk_utf_decode((char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDI,local_4);
    }
  }
  return local_4;
}

Assistant:

NK_API int
nk_utf_len(const char *str, int len)
{
const char *text;
int glyphs = 0;
int text_len;
int glyph_len;
int src_len = 0;
nk_rune unicode;

NK_ASSERT(str);
if (!str || !len) return 0;

text = str;
text_len = len;
glyph_len = nk_utf_decode(text, &unicode, text_len);
while (glyph_len && src_len < len) {
glyphs++;
src_len = src_len + glyph_len;
glyph_len = nk_utf_decode(text + src_len, &unicode, text_len - src_len);
}
return glyphs;
}